

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiKeyData * ImGui::GetKeyData(ImGuiKey key)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiKey in_EDI;
  int index;
  ImGuiContext *g;
  int local_18;
  int local_14;
  
  pIVar1 = GImGui;
  bVar2 = IsLegacyKey(in_EDI);
  local_14 = in_EDI;
  if (bVar2) {
    local_18 = in_EDI;
    if ((pIVar1->IO).KeyMap[in_EDI] != -1) {
      local_18 = (pIVar1->IO).KeyMap[in_EDI];
    }
    local_14 = local_18;
  }
  return (pIVar1->IO).KeysData + local_14;
}

Assistant:

ImGuiKeyData* ImGui::GetKeyData(ImGuiKey key)
{
    ImGuiContext& g = *GImGui;
    int index;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT(key >= ImGuiKey_LegacyNativeKey_BEGIN && key < ImGuiKey_NamedKey_END);
    if (IsLegacyKey(key))
        index = (g.IO.KeyMap[key] != -1) ? g.IO.KeyMap[key] : key; // Remap native->imgui or imgui->native
    else
        index = key;
#else
    IM_ASSERT(IsNamedKey(key) && "Support for user key indices was dropped in favor of ImGuiKey. Please update backend & user code.");
    index = key - ImGuiKey_NamedKey_BEGIN;
#endif
    return &g.IO.KeysData[index];
}